

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O3

vm_obj_id_t CVmObjFile::get_charset_arg(int argn,int argc)

{
  vm_obj_id_t vVar1;
  size_t charset_name_len;
  char csname [32];
  char acStack_28 [32];
  
  if ((argn < argc) && (vVar1 = CVmBif::get_charset_obj(argn), vVar1 != 0)) {
    return vVar1;
  }
  os_get_charmap(acStack_28,3);
  charset_name_len = strlen(acStack_28);
  vVar1 = CVmObjCharSet::create(0,acStack_28,charset_name_len);
  return vVar1;
}

Assistant:

vm_obj_id_t CVmObjFile::get_charset_arg(VMG_ int argn, int argc)
{
    /* presume we won't find a valid argument value */
    vm_obj_id_t obj = VM_INVALID_OBJ;

    /* if there's an argument, pop it */
    if (argn < argc)
        obj = CVmBif::get_charset_obj(vmg_ argn);
    
    /* if we don't have a character set yet, create the default */
    if (obj == VM_INVALID_OBJ)
    {
        /* get the default local character set for file contents */
        char csname[32];
        os_get_charmap(csname, OS_CHARMAP_FILECONTENTS);
        
        /* create the mapper */
        obj = CVmObjCharSet::create(vmg_ FALSE, csname, strlen(csname));
    }

    /* return the character set */
    return obj;
}